

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_key.cpp
# Opt level: O1

void __thiscall
cfdcapi_key_PrivkeyAndPubkeyTest_Test::~cfdcapi_key_PrivkeyAndPubkeyTest_Test
          (cfdcapi_key_PrivkeyAndPubkeyTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(cfdcapi_key, PrivkeyAndPubkeyTest) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  static constexpr const int kNetwork = kCfdNetworkRegtest;

  bool is_compressed = false;
  int network_type = kCfdNetworkRegtest;
  char* pubkey = nullptr;
  char* pubkey2 = nullptr;
  char* privkey = nullptr;
  char* privkey2 = nullptr;
  char* wif = nullptr;
  char* wif2 = nullptr;
  ret = CfdCreateKeyPair(handle, true, kNetwork, &pubkey, &privkey, &wif);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_EQ(66, strlen(pubkey));
    EXPECT_EQ(64, strlen(privkey));
    EXPECT_EQ(52, strlen(wif));

    ret = CfdGetPrivkeyFromWif(handle, wif, kNetwork, &privkey2);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(privkey, privkey2);
      CfdFreeStringBuffer(privkey2);
    }

    ret = CfdGetPubkeyFromPrivkey(handle, privkey, nullptr, true, &pubkey2);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(pubkey, pubkey2);
      CfdFreeStringBuffer(pubkey2);
    }

    CfdFreeStringBuffer(pubkey);
    CfdFreeStringBuffer(privkey);
    CfdFreeStringBuffer(wif);
  }

  ret = CfdCreateKeyPair(handle, false, kNetwork, &pubkey, &privkey, &wif);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_EQ(130, strlen(pubkey));
    EXPECT_EQ(64, strlen(privkey));
    EXPECT_EQ(51, strlen(wif));

    ret = CfdGetPrivkeyFromWif(handle, wif, kNetwork, &privkey2);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(privkey, privkey2);
      CfdFreeStringBuffer(privkey2);
    }

    ret = CfdParsePrivkeyWif(
        handle, wif, &privkey2, &network_type, &is_compressed);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_EQ(network_type, kCfdNetworkTestnet);
      EXPECT_FALSE(is_compressed);
      EXPECT_STREQ(privkey, privkey2);
      CfdFreeStringBuffer(privkey2);
    }

    ret = CfdGetPrivkeyWif(handle, privkey, kNetwork, false, &wif2);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(wif, wif2);
      CfdFreeStringBuffer(wif2);
    }

    void* handle2 = NULL;
    ret = CfdCreateHandle(&handle2);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_FALSE((NULL == handle2));

    ret = CfdGetPrivkeyWif(handle2, privkey, kCfdNetworkElementsRegtest,
        false, &wif2);
    EXPECT_EQ(kCfdIllegalArgumentError, ret);
    if (ret == kCfdIllegalArgumentError) {
      char* err_msg = NULL;
      ret = CfdGetLastErrorMessage(handle2, &err_msg);
      EXPECT_EQ(kCfdSuccess, ret);
#ifndef CFD_DISABLE_ELEMENTS
      EXPECT_STREQ("Failed to parameter. privkey's network_type is invalid.",
          err_msg);
#else  // CFD_DISABLE_ELEMENTS
      EXPECT_STREQ("Illegal network type.", err_msg);
#endif  // CFD_DISABLE_ELEMENTS
      CfdFreeStringBuffer(err_msg);
      err_msg = NULL;
    }
    ret = CfdFreeHandle(handle2);
    EXPECT_EQ(kCfdSuccess, ret);

    ret = CfdGetPubkeyFromPrivkey(handle, privkey, nullptr, false, &pubkey2);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(pubkey, pubkey2);
      CfdFreeStringBuffer(pubkey2);
    }

    CfdFreeStringBuffer(pubkey);
    CfdFreeStringBuffer(privkey);
    CfdFreeStringBuffer(wif);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}